

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitState<unsigned_short>,short,duckdb::BitXorOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  ushort uVar1;
  unsigned_long *puVar2;
  ushort *puVar3;
  data_ptr_t pdVar4;
  ulong uVar5;
  sel_t *psVar6;
  byte bVar7;
  ushort uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  idx_t iVar12;
  ulong uVar13;
  idx_t iVar14;
  ulong uVar15;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_68;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar4 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar9 = 0;
      uVar13 = 0;
      do {
        if (puVar2 == (unsigned_long *)0x0) {
          uVar10 = uVar13 + 0x40;
          if (count <= uVar13 + 0x40) {
            uVar10 = count;
          }
LAB_00dcb678:
          uVar11 = uVar13;
          if (uVar13 < uVar10) {
            bVar7 = *state;
            uVar8 = *(ushort *)(state + 2);
            do {
              uVar1 = *(ushort *)(pdVar4 + uVar13 * 2);
              if ((bVar7 & 1) == 0) {
                *state = '\x01';
                bVar7 = 1;
                uVar8 = uVar1;
              }
              else {
                uVar8 = uVar1 ^ uVar8;
              }
              uVar13 = uVar13 + 1;
            } while (uVar10 != uVar13);
            *(ushort *)(state + 2) = uVar8;
            uVar11 = uVar10;
          }
        }
        else {
          uVar5 = puVar2[uVar9];
          uVar10 = uVar13 + 0x40;
          if (count <= uVar13 + 0x40) {
            uVar10 = count;
          }
          if (uVar5 == 0xffffffffffffffff) goto LAB_00dcb678;
          uVar11 = uVar10;
          if ((uVar5 != 0) && (uVar11 = uVar13, uVar13 < uVar10)) {
            uVar15 = 0;
            do {
              if ((uVar5 >> (uVar15 & 0x3f) & 1) != 0) {
                uVar8 = *(ushort *)(pdVar4 + uVar15 * 2 + uVar13 * 2);
                if (*state == '\0') {
                  *(ushort *)(state + 2) = uVar8;
                  *state = '\x01';
                }
                else {
                  *(ushort *)(state + 2) = *(ushort *)(state + 2) ^ uVar8;
                }
              }
              uVar15 = uVar15 + 1;
              uVar11 = uVar10;
            } while (uVar10 - uVar13 != uVar15);
          }
        }
        uVar9 = uVar9 + 1;
        uVar13 = uVar11;
      } while (uVar9 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) && (count != 0)) {
      puVar3 = (ushort *)input->data;
      bVar7 = *state;
      do {
        uVar8 = *puVar3;
        if ((bVar7 & 1) == 0) {
          *state = '\x01';
          bVar7 = 1;
        }
        else {
          uVar8 = uVar8 ^ *(ushort *)(state + 2);
        }
        *(ushort *)(state + 2) = uVar8;
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
    Vector::ToUnifiedFormat(input,count,&local_68);
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar6 = (local_68.sel)->sel_vector;
        bVar7 = *state;
        uVar8 = *(ushort *)(state + 2);
        iVar12 = 0;
        do {
          iVar14 = iVar12;
          if (psVar6 != (sel_t *)0x0) {
            iVar14 = (idx_t)psVar6[iVar12];
          }
          uVar1 = *(ushort *)(local_68.data + iVar14 * 2);
          if ((bVar7 & 1) == 0) {
            *state = '\x01';
            bVar7 = 1;
            uVar8 = uVar1;
          }
          else {
            uVar8 = uVar1 ^ uVar8;
          }
          iVar12 = iVar12 + 1;
        } while (count != iVar12);
        *(ushort *)(state + 2) = uVar8;
      }
    }
    else if (count != 0) {
      psVar6 = (local_68.sel)->sel_vector;
      iVar12 = 0;
      do {
        iVar14 = iVar12;
        if (psVar6 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar6[iVar12];
        }
        if ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar14 >> 6]
             >> (iVar14 & 0x3f) & 1) != 0) {
          if (*state == '\0') {
            *(ushort *)(state + 2) = *(ushort *)(local_68.data + iVar14 * 2);
            *state = '\x01';
          }
          else {
            *(ushort *)(state + 2) =
                 *(ushort *)(state + 2) ^ *(ushort *)(local_68.data + iVar14 * 2);
          }
        }
        iVar12 = iVar12 + 1;
      } while (count != iVar12);
    }
    if (local_68.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}